

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_int8.h
# Opt level: O0

float ncnn::lstm_dynamic_quantize_get_absmax(float *ptr,int size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  float *pfVar6;
  int in_ESI;
  undefined1 (*in_RDI) [64];
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  double dVar9;
  undefined1 auVar10 [32];
  __m128 _p_2;
  __m128 _absmax;
  __m256 _p_1;
  __m256 _absmax_avx;
  __m512 _p;
  __m512 _absmax_avx512;
  int i;
  float absmax;
  __m512 abs_mask;
  __m128 x32;
  __m128 x64;
  __m128 x128;
  __m256 x256;
  __m256 abs_mask_1;
  __m128 x32_1;
  __m128 x64_1;
  __m128 x128_1;
  __m128 abs_mask_2;
  __m128 x32_2;
  __m128 x64_2;
  float local_a58;
  float local_a54;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined1 local_a40 [16];
  float local_a24;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined1 local_a00 [32];
  float local_9c4;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 uStack_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined1 local_980 [64];
  int local_91c;
  float local_918;
  int local_914;
  undefined1 (*local_910) [64];
  undefined1 (*local_908) [64];
  undefined1 local_900 [64];
  undefined4 local_8bc;
  undefined1 (*local_8b8) [64];
  undefined4 local_8ac;
  undefined1 (*local_8a8) [64];
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 local_884;
  undefined1 local_880 [32];
  undefined4 local_860;
  undefined4 local_85c;
  undefined4 local_858;
  undefined4 local_854;
  undefined4 local_850;
  undefined4 local_84c;
  undefined4 local_848;
  undefined4 local_844;
  undefined1 local_840 [64];
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 uStack_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 uStack_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 uStack_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined4 local_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [24];
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_520 [32];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [32];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [16];
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [16];
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined4 local_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [16];
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined4 local_3b0;
  undefined4 local_3ac;
  undefined4 local_3a8;
  undefined4 local_3a4;
  undefined4 local_3a0;
  undefined4 local_39c;
  undefined4 local_398;
  undefined4 local_394;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_330 [16];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 local_2f0 [16];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined1 local_2d0 [16];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined1 local_2b0 [16];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined4 local_254;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined1 local_230 [16];
  undefined4 local_220;
  undefined4 local_21c;
  undefined4 local_218;
  undefined4 local_214;
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [16];
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined4 local_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_918 = 0.0;
  local_91c = 0;
  local_8bc = 0;
  local_900 = vbroadcastss_avx512f(ZEXT416(0));
  local_980 = local_900;
  local_910 = in_RDI;
  while( true ) {
    if (in_ESI <= local_91c + 0xf) break;
    local_8b8 = local_910;
    local_9c0 = *(undefined8 *)*local_910;
    uStack_9b8 = *(undefined8 *)(*local_910 + 8);
    uStack_9b0 = *(undefined8 *)(*local_910 + 0x10);
    uStack_9a8 = *(undefined8 *)(*local_910 + 0x18);
    uStack_9a0 = *(undefined8 *)(*local_910 + 0x20);
    uStack_998 = *(undefined8 *)(*local_910 + 0x28);
    uStack_990 = *(undefined8 *)(*local_910 + 0x30);
    uStack_988 = *(undefined8 *)(*local_910 + 0x38);
    local_800 = local_980._0_8_;
    uStack_7f8 = local_980._8_8_;
    uStack_7f0 = local_980._16_8_;
    uStack_7e8 = local_980._24_8_;
    uStack_7e0 = local_980._32_8_;
    uStack_7d8 = local_980._40_8_;
    local_684 = 0x7fffffff;
    auVar8 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
    local_700 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(local_700);
    local_740 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(local_740);
    uStack_7c0 = auVar8._0_8_;
    uStack_7b8 = auVar8._8_8_;
    uStack_7b0 = auVar8._16_8_;
    uStack_7a8 = auVar8._24_8_;
    uStack_7a0 = auVar8._32_8_;
    uStack_798 = auVar8._40_8_;
    uStack_790 = auVar8._48_8_;
    uStack_788 = auVar8._56_8_;
    local_640 = uStack_7c0;
    uStack_638 = uStack_7b8;
    uStack_630 = uStack_7b0;
    uStack_628 = uStack_7a8;
    uStack_620 = uStack_7a0;
    uStack_618 = uStack_798;
    uStack_610 = uStack_790;
    uStack_608 = uStack_788;
    local_840 = vpandd_avx512f(auVar8,*local_910);
    local_980 = vmaxps_avx512f(local_980,local_840);
    local_910 = local_910 + 1;
    local_91c = local_91c + 0x10;
    local_780 = local_9c0;
    uStack_778 = uStack_9b8;
    uStack_770 = uStack_9b0;
    uStack_768 = uStack_9a8;
    uStack_760 = uStack_9a0;
    uStack_758 = uStack_998;
    uStack_750 = uStack_990;
    uStack_748 = uStack_988;
    local_680 = local_9c0;
    uStack_678 = uStack_9b8;
    uStack_670 = uStack_9b0;
    uStack_668 = uStack_9a8;
    uStack_660 = uStack_9a0;
    uStack_658 = uStack_998;
    uStack_650 = uStack_990;
    uStack_648 = uStack_988;
  }
  local_580 = local_980._0_8_;
  uStack_578 = local_980._8_8_;
  uStack_570 = local_980._16_8_;
  uStack_568 = local_980._24_8_;
  uStack_560 = local_980._32_8_;
  uStack_558 = local_980._40_8_;
  uStack_550 = local_980._48_8_;
  uStack_548 = local_980._56_8_;
  local_1c0 = local_980._0_8_;
  uStack_1b8 = local_980._8_8_;
  uStack_1b0 = local_980._16_8_;
  uStack_1a8 = local_980._24_8_;
  uStack_1a0 = local_980._32_8_;
  uStack_198 = local_980._40_8_;
  uStack_190 = local_980._48_8_;
  uStack_188 = local_980._56_8_;
  local_500 = local_980._0_8_;
  uStack_4f8 = local_980._8_8_;
  uStack_4f0 = local_980._16_8_;
  uStack_4e8 = local_980._24_8_;
  auVar7 = vextractf64x4_avx512f(local_980,1);
  uStack_7d0 = auVar7._0_8_;
  uStack_7c8 = auVar7._8_8_;
  uStack_7c0 = auVar7._16_8_;
  uStack_7b8 = auVar7._24_8_;
  _local_5a0 = vmaxps_avx(local_980._0_32_,local_520);
  local_160 = local_5a0._0_8_;
  uStack_158 = local_5a0._8_8_;
  uStack_150 = local_5a0._16_8_;
  uStack_148 = uStack_588;
  uStack_2b8 = uStack_588;
  local_2c0 = local_5a0._16_8_;
  local_5b0 = vmaxps_avx(stack0xfffffffffffffa70,local_2d0);
  local_f0 = local_5b0._0_8_;
  uStack_e8 = local_5b0._8_8_;
  local_100 = local_5b0._0_8_;
  uStack_f8 = local_5b0._8_8_;
  local_2f0 = vunpckhpd_avx(local_5b0,local_5b0);
  local_2e0 = local_5b0._0_8_;
  uStack_2d8 = local_5b0._8_8_;
  local_5c0 = vmaxps_avx(local_5b0,local_2f0);
  local_90 = local_5c0._0_8_;
  uStack_88 = local_5c0._8_8_;
  local_a0 = local_5c0._4_4_;
  uStack_9c = local_5c0._4_4_;
  uStack_98 = local_5c0._4_4_;
  uStack_94 = local_5c0._4_4_;
  auVar1._4_4_ = local_5c0._4_4_;
  auVar1._0_4_ = local_5c0._4_4_;
  auVar1._8_4_ = local_5c0._4_4_;
  auVar1._12_4_ = local_5c0._4_4_;
  local_5d0 = vmaxss_avx(local_5c0,auVar1);
  local_60 = local_5d0._0_8_;
  uVar5 = local_60;
  uStack_58 = local_5d0._8_8_;
  local_60._0_4_ = local_5d0._0_4_;
  local_9c4 = (float)local_60;
  local_914 = in_ESI;
  local_60 = uVar5;
  pfVar6 = std::max<float>(&local_918,&local_9c4);
  auVar10._8_8_ = local_460._8_8_;
  auVar10._0_8_ = local_460._0_8_;
  local_918 = *pfVar6;
  local_8ac = 0;
  local_844 = 0;
  local_848 = 0;
  local_84c = 0;
  local_850 = 0;
  local_854 = 0;
  local_858 = 0;
  local_85c = 0;
  local_860 = 0;
  auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
  auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
  auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
  auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
  local_a00._0_16_ = vinsertps_avx(auVar2,ZEXT416(0),0x30);
  auVar7._16_16_ = auVar1;
  auVar7._0_16_ = local_a00._0_16_;
  local_880._16_8_ = auVar1._0_8_;
  local_880._24_8_ = auVar1._8_8_;
  local_a00._16_8_ = local_880._16_8_;
  local_a00._24_8_ = local_880._24_8_;
  while( true ) {
    if (local_914 <= local_91c + 7) break;
    local_8a8 = local_910;
    local_a20 = *(undefined8 *)*local_910;
    uStack_a18 = *(undefined8 *)(*local_910 + 8);
    uStack_a10 = *(undefined8 *)(*local_910 + 0x10);
    uStack_a08 = *(undefined8 *)(*local_910 + 0x18);
    local_4c0 = local_a00._0_8_;
    uStack_4b8 = local_a00._8_8_;
    uStack_4b0 = local_a00._16_8_;
    uStack_4a8 = local_a00._24_8_;
    local_424 = 0x7fffffff;
    local_3b0 = 0x7fffffff;
    auVar1 = vpinsrd_avx(ZEXT416(0x7fffffff),0x7fffffff,1);
    auVar1 = vpinsrd_avx(auVar1,0x7fffffff,2);
    auVar1 = vpinsrd_avx(auVar1,0x7fffffff,3);
    auVar2 = vpinsrd_avx(ZEXT416(0x7fffffff),0x7fffffff,1);
    auVar2 = vpinsrd_avx(auVar2,0x7fffffff,2);
    auVar2 = vpinsrd_avx(auVar2,0x7fffffff,3);
    auVar10._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
    auVar10._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    local_3e0._16_8_ = auVar10._16_8_;
    uStack_450 = local_3e0._16_8_;
    local_3e0._24_8_ = auVar10._24_8_;
    uStack_448 = local_3e0._24_8_;
    uStack_490 = local_3e0._16_8_;
    uStack_488 = local_3e0._24_8_;
    uStack_3f0 = local_3e0._16_8_;
    uStack_3e8 = local_3e0._24_8_;
    auVar3._16_8_ = local_3e0._16_8_;
    auVar3._0_16_ = auVar10._0_16_;
    auVar3._24_8_ = local_3e0._24_8_;
    local_4e0 = vpand_avx2(auVar3,*(undefined1 (*) [32])*local_910);
    local_a00 = vmaxps_avx(local_a00,local_4e0);
    local_910 = (undefined1 (*) [64])(*local_910 + 0x20);
    local_91c = local_91c + 8;
    local_480 = local_a20;
    uStack_478 = uStack_a18;
    uStack_470 = uStack_a10;
    uStack_468 = uStack_a08;
    local_420 = local_a20;
    uStack_418 = uStack_a18;
    uStack_410 = uStack_a10;
    uStack_408 = uStack_a08;
    local_3e0 = auVar10;
    local_3ac = local_3b0;
    local_3a8 = local_3b0;
    local_3a4 = local_3b0;
    local_3a0 = local_3b0;
    local_39c = local_3b0;
    local_398 = local_3b0;
    local_394 = local_3b0;
    local_4a0 = auVar10._0_16_;
    local_400 = auVar10._0_16_;
  }
  local_360 = local_a00._0_8_;
  uStack_358 = local_a00._8_8_;
  uStack_350 = local_a00._16_8_;
  uStack_348 = local_a00._24_8_;
  local_180 = local_a00._0_8_;
  uStack_178 = local_a00._8_8_;
  uStack_170 = local_a00._16_8_;
  uStack_168 = local_a00._24_8_;
  local_300 = local_a00._16_8_;
  uStack_2f8 = local_a00._24_8_;
  local_310 = local_a00._0_8_;
  uStack_308 = local_a00._8_8_;
  local_370 = vmaxps_avx(local_a00._16_16_,local_a00._0_16_);
  local_110 = local_370._0_8_;
  uStack_108 = local_370._8_8_;
  local_120 = local_370._0_8_;
  uStack_118 = local_370._8_8_;
  local_330 = vunpckhpd_avx(local_370,local_370);
  local_320 = local_370._0_8_;
  uStack_318 = local_370._8_8_;
  local_380 = vmaxps_avx(local_370,local_330);
  local_b0 = local_380._0_8_;
  uStack_a8 = local_380._8_8_;
  local_c0 = local_380._4_4_;
  uStack_bc = local_380._4_4_;
  uStack_b8 = local_380._4_4_;
  uStack_b4 = local_380._4_4_;
  auVar2._4_4_ = local_380._4_4_;
  auVar2._0_4_ = local_380._4_4_;
  auVar2._8_4_ = local_380._4_4_;
  auVar2._12_4_ = local_380._4_4_;
  local_390 = vmaxss_avx(local_380,auVar2);
  local_70 = local_390._0_8_;
  uVar5 = local_70;
  uStack_68 = local_390._8_8_;
  local_70._0_4_ = local_390._0_4_;
  local_a24 = (float)local_70;
  local_880 = auVar7;
  local_70 = uVar5;
  local_460 = auVar10._0_16_;
  pfVar6 = std::max<float>(&local_918,&local_a24);
  local_918 = *pfVar6;
  local_884 = 0;
  local_8a0 = 0;
  uStack_89c = 0;
  uStack_898 = 0;
  uStack_894 = 0;
  local_a40 = ZEXT816(0);
  while( true ) {
    if (local_914 <= local_91c + 3) break;
    local_908 = local_910;
    local_a50 = *(undefined8 *)*local_910;
    uStack_a48 = *(undefined8 *)(*local_910 + 8);
    local_2a0 = local_a40._0_8_;
    uStack_298 = local_a40._8_8_;
    local_254 = 0x7fffffff;
    local_220 = 0x7fffffff;
    auVar1 = vpinsrd_avx(ZEXT416(0x7fffffff),0x7fffffff,1);
    auVar1 = vpinsrd_avx(auVar1,0x7fffffff,2);
    local_230 = vpinsrd_avx(auVar1,0x7fffffff,3);
    local_270 = local_230._0_8_;
    uStack_268 = local_230._8_8_;
    local_290 = local_230._0_8_;
    uStack_288 = local_230._8_8_;
    local_240 = local_230._0_8_;
    uStack_238 = local_230._8_8_;
    local_2b0 = vpand_avx(local_230,*(undefined1 (*) [16])*local_910);
    local_a40 = vmaxps_avx(local_a40,local_2b0);
    local_910 = (undefined1 (*) [64])(*local_910 + 0x10);
    local_91c = local_91c + 4;
    local_280 = local_a50;
    uStack_278 = uStack_a48;
    local_250 = local_a50;
    uStack_248 = uStack_a48;
    local_21c = local_220;
    local_218 = local_220;
    local_214 = local_220;
  }
  local_1f0 = local_a40._0_8_;
  uStack_1e8 = local_a40._8_8_;
  local_130 = local_a40._0_8_;
  uStack_128 = local_a40._8_8_;
  local_140 = local_a40._0_8_;
  uStack_138 = local_a40._8_8_;
  local_1e0 = vunpckhpd_avx(local_a40,local_a40);
  local_1d0 = local_a40._0_8_;
  uStack_1c8 = local_a40._8_8_;
  local_200 = vmaxps_avx(local_a40,local_1e0);
  local_d0 = local_200._0_8_;
  uStack_c8 = local_200._8_8_;
  local_e0 = local_200._4_4_;
  uStack_dc = local_200._4_4_;
  uStack_d8 = local_200._4_4_;
  uStack_d4 = local_200._4_4_;
  auVar4._4_4_ = local_200._4_4_;
  auVar4._0_4_ = local_200._4_4_;
  auVar4._8_4_ = local_200._4_4_;
  auVar4._12_4_ = local_200._4_4_;
  local_210 = vmaxss_avx(local_200,auVar4);
  local_80 = local_210._0_8_;
  uVar5 = local_80;
  uStack_78 = local_210._8_8_;
  local_80._0_4_ = local_210._0_4_;
  local_a54 = (float)local_80;
  local_80 = uVar5;
  pfVar6 = std::max<float>(&local_918,&local_a54);
  local_918 = *pfVar6;
  while( true ) {
    if (local_914 <= local_91c) break;
    dVar9 = std::fabs((double)(ulong)*(uint *)*local_910);
    local_a58 = SUB84(dVar9,0);
    pfVar6 = std::max<float>(&local_918,&local_a58);
    local_918 = *pfVar6;
    local_910 = (undefined1 (*) [64])(*local_910 + 4);
    local_91c = local_91c + 1;
  }
  return local_918;
}

Assistant:

static float lstm_dynamic_quantize_get_absmax(const float* ptr, int size)
{
    float absmax = 0.f;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _absmax_avx512 = _mm512_set1_ps(0.f);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        _absmax_avx512 = _mm512_max_ps(_absmax_avx512, abs512_ps(_p));
        ptr += 16;
    }
    absmax = std::max(absmax, _mm512_comp_reduce_max_ps(_absmax_avx512));
#endif // __AVX512F__
    __m256 _absmax_avx = _mm256_set1_ps(0.f);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        _absmax_avx = _mm256_max_ps(_absmax_avx, abs256_ps(_p));
        ptr += 8;
    }
    absmax = std::max(absmax, _mm256_reduce_max_ps(_absmax_avx));
#endif // __AVX__
    __m128 _absmax = _mm_set1_ps(0.f);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        _absmax = _mm_max_ps(_absmax, abs_ps(_p));
        ptr += 4;
    }
    absmax = std::max(absmax, _mm_reduce_max_ps(_absmax));
#endif // __SSE2__
    for (; i < size; i++)
    {
        absmax = std::max(absmax, (float)fabs(*ptr));
        ptr++;
    }

    return absmax;
}